

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

_Bool build_pipeline(ecs_world_t *world,ecs_entity_t pipeline,EcsPipelineQuery *pq)

{
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  int32_t iVar5;
  char *pcVar6;
  void *pvVar7;
  void *pvVar8;
  bool bVar9;
  ecs_sig_column_t *column_1;
  ecs_sig_column_t *column_array_1;
  int column_count_1;
  int column_i_1;
  ecs_sig_column_t *column;
  ecs_sig_column_t *column_array;
  int local_230;
  int column_count;
  int column_i;
  _Bool is_active;
  _Bool needs_merge;
  ecs_query_t *q;
  int i;
  EcsSystem *sys;
  ecs_iter_t it;
  ecs_query_t *query;
  ecs_vector_t *ops;
  ecs_pipeline_op_t *op;
  write_state_t ws;
  EcsPipelineQuery *pq_local;
  ecs_entity_t pipeline_local;
  ecs_world_t *world_local;
  
  ecs_query_iter((ecs_iter_t *)&ws.wildcard,pq->query);
  if (pq->match_count == pq->query->match_count) {
    world_local._7_1_ = false;
  }
  else {
    pcVar6 = ecs_get_name(world,pipeline);
    _ecs_trace(2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
               ,0xba,"rebuilding pipeline #[green]%s",pcVar6);
    (world->stats).pipeline_build_count_total = (world->stats).pipeline_build_count_total + 1;
    op = (ecs_pipeline_op_t *)_ecs_map_new(4,4,0x100);
    ws.components._0_1_ = 0;
    ops = (ecs_vector_t *)0x0;
    query = (ecs_query_t *)0x0;
    it.iter.parent.table.references = (ecs_ref_t *)pq->build_query;
    if (pq->ops != (ecs_vector_t *)0x0) {
      ecs_vector_free(pq->ops);
    }
    ecs_query_iter((ecs_iter_t *)&sys,(ecs_query_t *)it.iter.parent.table.references);
    while (_Var3 = ecs_query_next((ecs_iter_t *)&sys), _Var3) {
      pvVar7 = ecs_column_w_size((ecs_iter_t *)&sys,0x50,1);
      for (q._4_4_ = 0; q._4_4_ < it.frame_offset; q._4_4_ = q._4_4_ + 1) {
        lVar1 = *(long *)((long)pvVar7 + (long)q._4_4_ * 0x50 + 0x18);
        if (lVar1 != 0) {
          bVar9 = false;
          _Var3 = ecs_has_entity(world,*(ecs_entity_t *)((long)it.table_columns + (long)q._4_4_ * 8)
                                 ,0x105);
          _Var3 = (_Bool)((_Var3 ^ 0xffU) & 1);
          iVar5 = ecs_vector_count(*(ecs_vector_t **)(lVar1 + 0x10));
          pvVar8 = _ecs_vector_first(*(ecs_vector_t **)(lVar1 + 0x10),0x28,0x10);
          for (local_230 = 0; local_230 < iVar5; local_230 = local_230 + 1) {
            _Var4 = check_column((ecs_sig_column_t *)((long)pvVar8 + (long)local_230 * 0x28),_Var3,
                                 (write_state_t *)&op);
            bVar9 = bVar9 || _Var4;
          }
          if (bVar9) {
            reset_write_state((write_state_t *)&op);
            ops = (ecs_vector_t *)0x0;
            bVar9 = false;
            bVar2 = false;
            if (_Var3 != false) {
              iVar5 = ecs_vector_count(*(ecs_vector_t **)(lVar1 + 0x10));
              pvVar8 = _ecs_vector_first(*(ecs_vector_t **)(lVar1 + 0x10),0x28,0x10);
              for (column_array_1._4_4_ = 0; bVar2 = bVar9, column_array_1._4_4_ < iVar5;
                  column_array_1._4_4_ = column_array_1._4_4_ + 1) {
                _Var4 = check_column((ecs_sig_column_t *)
                                     ((long)pvVar8 + (long)column_array_1._4_4_ * 0x28),true,
                                     (write_state_t *)&op);
                bVar9 = bVar9 || _Var4;
              }
            }
            _ecs_assert(!bVar2,0xc,(char *)0x0,"needs_merge == false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                        ,0xf0);
            if (bVar2) {
              __assert_fail("needs_merge == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                            ,0xf0,
                            "_Bool build_pipeline(ecs_world_t *, ecs_entity_t, EcsPipelineQuery *)")
              ;
            }
          }
          if (ops == (ecs_vector_t *)0x0) {
            ops = (ecs_vector_t *)_ecs_vector_add((ecs_vector_t **)&query,4,0x10);
            ops->count = 0;
          }
          if (_Var3 != false) {
            ops->count = ops->count + 1;
          }
        }
      }
    }
    ecs_map_free((ecs_map_t *)op);
    pq->match_count = pq->query->match_count;
    pq->ops = (ecs_vector_t *)query;
    world_local._7_1_ = true;
  }
  return world_local._7_1_;
}

Assistant:

static
bool build_pipeline(
    ecs_world_t *world,
    ecs_entity_t pipeline,
    EcsPipelineQuery *pq)
{
    (void)pipeline;

    ecs_query_iter(pq->query);

    if (pq->match_count == pq->query->match_count) {
        /* No need to rebuild the pipeline */
        return false;
    }

    ecs_trace_2("rebuilding pipeline #[green]%s", 
        ecs_get_name(world, pipeline));

    world->stats.pipeline_build_count_total ++;

    write_state_t ws = {
        .components = ecs_map_new(int32_t, ECS_HI_COMPONENT_ID),
        .wildcard = false
    };

    ecs_pipeline_op_t *op = NULL;
    ecs_vector_t *ops = NULL;
    ecs_query_t *query = pq->build_query;

    if (pq->ops) {
        ecs_vector_free(pq->ops);
    }

    /* Iterate systems in pipeline, add ops for running / merging */
    ecs_iter_t it = ecs_query_iter(query);
    while (ecs_query_next(&it)) {
        EcsSystem *sys = ecs_column(&it, EcsSystem, 1);        

        int i;
        for (i = 0; i < it.count; i ++) {            
            ecs_query_t *q = sys[i].query;
            if (!q) {
                continue;
            }

            bool needs_merge = false;
            bool is_active = !ecs_has_entity(
                world, it.entities[i], EcsInactive);

            ecs_vector_each(q->sig.columns, ecs_sig_column_t, column, {
                needs_merge |= check_column(column, is_active, &ws);
            });

            if (needs_merge) {
                /* After merge all components will be merged, so reset state */
                reset_write_state(&ws);
                op = NULL;

                /* Re-evaluate columns to set write flags if system is active.
                 * If system is inactive, it can't write anything and so it
                 * should not insert unnecessary merges.  */
                needs_merge = false;
                if (is_active) {
                    ecs_vector_each(q->sig.columns, ecs_sig_column_t, column, {
                        needs_merge |= check_column(column, true, &ws);
                    });
                }

                /* The component states were just reset, so if we conclude that
                 * another merge is needed something is wrong. */
                ecs_assert(needs_merge == false, ECS_INTERNAL_ERROR, NULL);        
            }

            if (!op) {
                op = ecs_vector_add(&ops, ecs_pipeline_op_t);
                op->count = 0;
            }

            /* Don't increase count for inactive systems, as they are ignored by
             * the query used to run the pipeline. */
            if (is_active) {
                op->count ++;
            }
        }
    }

    ecs_map_free(ws.components);

    /* Force sort of query as this could increase the match_count */
    pq->match_count = pq->query->match_count;
    pq->ops = ops;

    return true;
}